

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpdf_xref.c
# Opt level: O1

HPDF_STATUS HPDF_Xref_WriteToStream(HPDF_Xref xref,HPDF_Stream_conflict stream,HPDF_Encrypt e)

{
  HPDF_Xref *pp_Var1;
  ushort gen_no;
  void *pvVar2;
  char *pcVar3;
  HPDF_STATUS HVar4;
  HPDF_BYTE *s;
  char *pcVar5;
  HPDF_Xref p_Var6;
  HPDF_List p_Var7;
  HPDF_STATUS unaff_R12;
  HPDF_UINT32 object_id;
  HPDF_UINT HVar8;
  bool bVar9;
  char buf [32];
  char local_58 [31];
  char local_39 [9];
  
  p_Var6 = xref;
  if (xref != (HPDF_Xref)0x0) {
    do {
      bVar9 = p_Var6->start_offset == 0;
      HVar8 = (HPDF_UINT)bVar9;
      p_Var7 = p_Var6->entries;
      if ((uint)bVar9 < p_Var7->count) {
        do {
          pvVar2 = HPDF_List_ItemAt(p_Var7,HVar8);
          object_id = p_Var6->start_offset + HVar8;
          gen_no = *(ushort *)((long)pvVar2 + 8);
          *(HPDF_UINT *)((long)pvVar2 + 4) = stream->size;
          pcVar3 = HPDF_IToA(local_58,object_id,local_39);
          *pcVar3 = ' ';
          pcVar3 = HPDF_IToA(pcVar3 + 1,(uint)gen_no,local_39);
          HPDF_StrCpy(pcVar3," obj\n",local_39);
          HVar4 = HPDF_Stream_WriteStr(stream,local_58);
          if (HVar4 == 0) {
            if (e != (HPDF_Encrypt)0x0) {
              HPDF_Encrypt_InitKey(e,object_id,gen_no);
            }
            HVar4 = HPDF_Obj_WriteValue(*(void **)((long)pvVar2 + 0x10),stream,e);
            if (HVar4 != 0) goto LAB_001363cb;
            HVar4 = HPDF_Stream_WriteStr(stream,"\nendobj\n");
            bVar9 = HVar4 == 0;
            if (!bVar9) {
              unaff_R12 = HVar4;
            }
          }
          else {
LAB_001363cb:
            bVar9 = false;
            unaff_R12 = HVar4;
          }
          if (!bVar9) {
            return unaff_R12;
          }
          HVar8 = HVar8 + 1;
          p_Var7 = p_Var6->entries;
        } while (HVar8 < p_Var7->count);
      }
      pp_Var1 = &p_Var6->prev;
      p_Var6 = *pp_Var1;
    } while (*pp_Var1 != (HPDF_Xref)0x0);
  }
  if (xref != (HPDF_Xref)0x0) {
    p_Var6 = xref;
    do {
      p_Var6->addr = stream->size;
      s = HPDF_StrCpy(local_58,"xref\n",local_39);
      pcVar3 = HPDF_IToA((char *)s,p_Var6->start_offset,local_39);
      *pcVar3 = ' ';
      pcVar3 = HPDF_IToA(pcVar3 + 1,p_Var6->entries->count,local_39);
      HPDF_StrCpy(pcVar3,"\n",local_39);
      HVar4 = HPDF_Stream_WriteStr(stream,local_58);
      if (HVar4 != 0) {
        return HVar4;
      }
      p_Var7 = p_Var6->entries;
      if (p_Var7->count != 0) {
        HVar8 = 0;
        do {
          pcVar3 = (char *)HPDF_List_ItemAt(p_Var7,HVar8);
          pcVar5 = HPDF_IToA2(local_58,*(HPDF_UINT32 *)(pcVar3 + 4),0xb);
          *pcVar5 = ' ';
          pcVar5 = HPDF_IToA2(pcVar5 + 1,(uint)*(ushort *)(pcVar3 + 8),6);
          *pcVar5 = ' ';
          pcVar5[1] = *pcVar3;
          HPDF_StrCpy(pcVar5 + 2,"\r\n",local_39);
          HVar4 = HPDF_Stream_WriteStr(stream,local_58);
          if (HVar4 != 0) {
            return HVar4;
          }
          HVar8 = HVar8 + 1;
          p_Var7 = p_Var6->entries;
        } while (HVar8 < p_Var7->count);
      }
      p_Var6 = p_Var6->prev;
    } while (p_Var6 != (HPDF_Xref)0x0);
  }
  HVar4 = WriteTrailer(xref,stream);
  return HVar4;
}

Assistant:

HPDF_STATUS
HPDF_Xref_WriteToStream  (HPDF_Xref    xref,
                          HPDF_Stream  stream,
                          HPDF_Encrypt e)
{
    HPDF_STATUS ret;
    HPDF_UINT i;
    char buf[HPDF_SHORT_BUF_SIZ];
    char* pbuf;
    char* eptr = buf + HPDF_SHORT_BUF_SIZ - 1;
    HPDF_UINT str_idx;
    HPDF_Xref tmp_xref = xref;

    /* write each objects of xref to the specified stream */

    HPDF_PTRACE((" HPDF_Xref_WriteToStream\n"));

    while (tmp_xref) {
        if (tmp_xref->start_offset == 0)
            str_idx = 1;
        else
            str_idx = 0;

        for (i = str_idx; i < tmp_xref->entries->count; i++) {
            HPDF_XrefEntry  entry =
                        (HPDF_XrefEntry)HPDF_List_ItemAt (tmp_xref->entries, i);
            HPDF_UINT obj_id = tmp_xref->start_offset + i;
            HPDF_UINT16 gen_no = entry->gen_no;

            entry->byte_offset = stream->size;

            pbuf = buf;
            pbuf = HPDF_IToA (pbuf, obj_id, eptr);
            *pbuf++ = ' ';
            pbuf = HPDF_IToA (pbuf, gen_no, eptr);
            HPDF_StrCpy(pbuf, " obj\012", eptr);

            if ((ret = HPDF_Stream_WriteStr (stream, buf)) != HPDF_OK)
               return ret;

            if (e)
                HPDF_Encrypt_InitKey (e, obj_id, gen_no);

            if ((ret = HPDF_Obj_WriteValue (entry->obj, stream, e)) != HPDF_OK)
                return ret;

            if ((ret = HPDF_Stream_WriteStr (stream, "\012endobj\012"))
                    != HPDF_OK)
                return ret;
       }

       tmp_xref = tmp_xref->prev;
    }

    /* start to write cross-reference table */

    tmp_xref = xref;

    while (tmp_xref) {
        tmp_xref->addr = stream->size;

        pbuf = buf;
        pbuf = (char *)HPDF_StrCpy (pbuf, "xref\012", eptr);
        pbuf = HPDF_IToA (pbuf, tmp_xref->start_offset, eptr);
        *pbuf++ = ' ';
        pbuf = HPDF_IToA (pbuf, tmp_xref->entries->count, eptr);
        HPDF_StrCpy (pbuf, "\012", eptr);
        ret = HPDF_Stream_WriteStr (stream, buf);
        if (ret != HPDF_OK)
            return ret;

        for (i = 0; i < tmp_xref->entries->count; i++) {
            HPDF_XrefEntry entry = HPDF_Xref_GetEntry(tmp_xref, i);

            pbuf = buf;
            pbuf = HPDF_IToA2 (pbuf, entry->byte_offset, HPDF_BYTE_OFFSET_LEN +
                    1);
            *pbuf++ = ' ';
            pbuf = HPDF_IToA2 (pbuf, entry->gen_no, HPDF_GEN_NO_LEN + 1);
            *pbuf++ = ' ';
            *pbuf++ = entry->entry_typ;
            HPDF_StrCpy (pbuf, "\015\012", eptr); /* Acrobat 8.15 requires both \r and \n here */
            ret = HPDF_Stream_WriteStr (stream, buf);
            if (ret != HPDF_OK)
                return ret;
        }

        tmp_xref = tmp_xref->prev;
    }

    /* write trailer dictionary */
    ret = WriteTrailer (xref, stream);

    return ret;
}